

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

char * JS_ToCStringLen2(JSContext *ctx,size_t *plen,JSValue val1,BOOL cesu8)

{
  byte bVar1;
  ushort uVar2;
  JSString *pJVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  JSString *buf;
  JSString *pJVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  uint16_t *src;
  JSValueUnion JVar14;
  JSString *pJVar15;
  
  if ((int)val1.tag == -7) {
    *(int *)val1.u.ptr = *val1.u.ptr + 1;
LAB_00119d81:
    JVar14 = val1.u;
    uVar4 = *(ulong *)((long)JVar14.ptr + 4);
    uVar10 = (uint)uVar4;
    uVar11 = uVar10 & 0x7fffffff;
    pJVar15 = (JSString *)((long)JVar14.ptr + 0x10);
    if ((int)uVar10 < 0) {
      pJVar3 = js_alloc_string(ctx,uVar11 * 3,0);
      if (pJVar3 == (JSString *)0x0) goto LAB_00119f09;
      buf = pJVar3 + 1;
      if ((uVar4 & 0x7fffffff) != 0) {
        iVar9 = 0;
        do {
          iVar12 = iVar9 + 1;
          uVar2 = *(ushort *)((long)&(pJVar15->header).ref_count + (long)iVar9 * 2);
          uVar10 = (uint)uVar2;
          if (uVar2 < 0x80) {
            *(char *)&(buf->header).ref_count = (char)uVar2;
            buf = (JSString *)((long)&(buf->header).ref_count + 1);
          }
          else {
            if (((((uVar2 & 0xfc00) == 0xd800) && (cesu8 == 0)) && (iVar12 < (int)uVar11)) &&
               (uVar5 = (uint)*(ushort *)((long)&(pJVar15->header).ref_count + (long)iVar12 * 2),
               (uVar5 & 0xfc00) == 0xdc00)) {
              iVar12 = iVar9 + 2;
              uVar10 = (uVar2 & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000;
            }
            iVar9 = unicode_to_utf8((uint8_t *)buf,uVar10);
            buf = (JSString *)((long)&(buf->header).ref_count + (long)iVar9);
          }
          iVar9 = iVar12;
        } while (iVar12 < (int)uVar11);
      }
LAB_00119f25:
      *(undefined1 *)&(buf->header).ref_count = 0;
      pJVar15 = pJVar3 + 1;
      *(ulong *)&pJVar3->field_0x4 =
           *(ulong *)&pJVar3->field_0x4 & 0xffffffff80000000 |
           (ulong)((int)buf - (int)pJVar15 & 0x7fffffff);
      if ((0xfffffff4 < (uint)val1.tag) &&
         (iVar9 = *JVar14.ptr, *(int *)JVar14.ptr = iVar9 + -1, iVar9 < 2)) {
        __JS_FreeValueRT(ctx->rt,val1);
      }
      if (plen == (size_t *)0x0) {
        return (char *)pJVar15;
      }
      uVar10 = (uint)*(undefined8 *)&pJVar3->field_0x4;
    }
    else {
      if ((uVar4 & 0x7fffffff) != 0) {
        uVar6 = 0;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + (uint)(*(byte *)((long)&(pJVar15->header).ref_count + uVar6) >> 7);
          uVar6 = uVar6 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar6);
        if (iVar9 != 0) {
          pJVar3 = js_alloc_string(ctx,iVar9 + uVar11,0);
          if (pJVar3 == (JSString *)0x0) goto LAB_00119f09;
          buf = pJVar3 + 1;
          if ((uVar4 & 0x7fffffff) != 0) {
            uVar4 = 0;
            pJVar7 = buf;
            do {
              bVar1 = *(byte *)((long)&(pJVar15->header).ref_count + uVar4);
              if ((char)bVar1 < '\0') {
                bVar8 = bVar1 >> 6 | 0xc0;
                buf = (JSString *)((long)&(pJVar7->header).ref_count + 2);
                *(byte *)((long)&(pJVar7->header).ref_count + 1) = bVar1 & 0xbf;
              }
              else {
                buf = (JSString *)((long)&(pJVar7->header).ref_count + 1);
                bVar8 = bVar1;
              }
              *(byte *)&(pJVar7->header).ref_count = bVar8;
              uVar4 = uVar4 + 1;
              pJVar7 = buf;
            } while ((uVar10 & 0x7fffffff) != uVar4);
          }
          goto LAB_00119f25;
        }
      }
      if (plen == (size_t *)0x0) {
        return (char *)pJVar15;
      }
    }
    sVar13 = (size_t)(uVar10 & 0x7fffffff);
  }
  else {
    val1 = JS_ToStringInternal(ctx,val1,0);
    if ((int)val1.tag != 6) goto LAB_00119d81;
LAB_00119f09:
    sVar13 = 0;
    pJVar15 = (JSString *)0x0;
    if (plen == (size_t *)0x0) {
      return (char *)0x0;
    }
  }
  *plen = sVar13;
  return (char *)pJVar15;
}

Assistant:

const char *JS_ToCStringLen2(JSContext *ctx, size_t *plen, JSValueConst val1, BOOL cesu8)
{
    JSValue val;
    JSString *str, *str_new;
    int pos, len, c, c1;
    uint8_t *q;

    if (JS_VALUE_GET_TAG(val1) != JS_TAG_STRING) {
        val = JS_ToString(ctx, val1);
        if (JS_IsException(val))
            goto fail;
    } else {
        val = JS_DupValue(ctx, val1);
    }

    str = JS_VALUE_GET_STRING(val);
    len = str->len;
    if (!str->is_wide_char) {
        const uint8_t *src = str->u.str8;
        int count;

        /* count the number of non-ASCII characters */
        /* Scanning the whole string is required for ASCII strings,
           and computing the number of non-ASCII bytes is less expensive
           than testing each byte, hence this method is faster for ASCII
           strings, which is the most common case.
         */
        count = 0;
        for (pos = 0; pos < len; pos++) {
            count += src[pos] >> 7;
        }
        if (count == 0) {
            if (plen)
                *plen = len;
            return (const char *)src;
        }
        str_new = js_alloc_string(ctx, len + count, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        for (pos = 0; pos < len; pos++) {
            c = src[pos];
            if (c < 0x80) {
                *q++ = c;
            } else {
                *q++ = (c >> 6) | 0xc0;
                *q++ = (c & 0x3f) | 0x80;
            }
        }
    } else {
        const uint16_t *src = str->u.str16;
        /* Allocate 3 bytes per 16 bit code point. Surrogate pairs may
           produce 4 bytes but use 2 code points.
         */
        str_new = js_alloc_string(ctx, len * 3, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        pos = 0;
        while (pos < len) {
            c = src[pos++];
            if (c < 0x80) {
                *q++ = c;
            } else {
                if (c >= 0xd800 && c < 0xdc00) {
                    if (pos < len && !cesu8) {
                        c1 = src[pos];
                        if (c1 >= 0xdc00 && c1 < 0xe000) {
                            pos++;
                            /* surrogate pair */
                            c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
                        } else {
                            /* Keep unmatched surrogate code points */
                            /* c = 0xfffd; */ /* error */
                        }
                    } else {
                        /* Keep unmatched surrogate code points */
                        /* c = 0xfffd; */ /* error */
                    }
                }
                q += unicode_to_utf8(q, c);
            }
        }
    }

    *q = '\0';
    str_new->len = q - str_new->u.str8;
    JS_FreeValue(ctx, val);
    if (plen)
        *plen = str_new->len;
    return (const char *)str_new->u.str8;
 fail:
    if (plen)
        *plen = 0;
    return NULL;
}